

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O3

int fd_flush(hFILE *fpv)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  do {
    iVar2 = fsync(*(int *)&fpv[1].buffer);
    if (-1 < iVar2) {
      return iVar2;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
  } while (iVar1 == 4);
  if ((iVar1 == 0x5f) || (iVar1 == 0x16)) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int fd_flush(hFILE *fpv)
{
    hFILE_fd *fp = (hFILE_fd *) fpv;
    int ret;
    do {
#ifdef HAVE_FDATASYNC
        ret = fdatasync(fp->fd);
#else
        ret = fsync(fp->fd);
#endif
        // Ignore invalid-for-fsync(2) errors due to being, e.g., a pipe,
        // and operation-not-supported errors (Mac OS X)
        if (ret < 0 && (errno == EINVAL || errno == ENOTSUP)) ret = 0;
    } while (ret < 0 && errno == EINTR);
    return ret;
}